

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

int xercesc_4_0::XMLString::lastIndexOf(char *toSearch,char ch)

{
  size_t sVar1;
  int local_24;
  int i;
  int len;
  char ch_local;
  char *toSearch_local;
  
  sVar1 = strlen(toSearch);
  local_24 = (int)sVar1;
  if (local_24 < 0) {
    toSearch_local._4_4_ = -1;
  }
  else {
    do {
      local_24 = local_24 + -1;
      if (local_24 < 0) {
        return -1;
      }
    } while (toSearch[local_24] != ch);
    toSearch_local._4_4_ = local_24;
  }
  return toSearch_local._4_4_;
}

Assistant:

int XMLString::lastIndexOf(const char* const toSearch, const char ch)
{
    const int len = (int)strlen(toSearch);
    if (len < 0) {
        return -1;
    }

    for (int i = len-1; i >= 0; i--)
    {
        if (toSearch[i] == ch)
            return i;
    }
    return -1;
}